

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobShape::BlobShape(BlobShape *this)

{
  BlobShape *pBVar1;
  BlobShape *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobShape_00d4d7d0
  ;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->dim_);
  pBVar1 = internal_default_instance();
  if (this != pBVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

BlobShape::BlobShape()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.BlobShape)
}